

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

String * __thiscall Json::Value::asString_abi_cxx11_(String *__return_storage_ptr__,Value *this)

{
  byte bVar1;
  uint uVar2;
  char *__s;
  uint *__s_00;
  String SStack_1a8;
  OStringStream oss;
  size_t sVar3;
  
  bVar1 = (byte)*(ushort *)&this->bits_;
  if (5 < bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Type is not convertible to string");
    std::__cxx11::stringbuf::str();
    throwLogicError(&SStack_1a8);
  }
  switch(bVar1) {
  case 1:
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)(this->value_).map_,0x5d2f74);
    break;
  case 2:
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)(this->value_).map_,0x5d2f74);
    break;
  case 3:
    valueToString_abi_cxx11_
              (__return_storage_ptr__,(Json *)&DAT_00000011,(this->value_).real_,0,
               (&switchD_0045f104::switchdataD_005d2f74)[bVar1] + 0x5d2f74);
    break;
  case 4:
    __s_00 = (uint *)(this->value_).string_;
    if (__s_00 != (uint *)0x0) {
      if ((*(ushort *)&this->bits_ >> 8 & 1) == 0) {
        sVar3 = strlen((char *)__s_00);
        uVar2 = (uint)sVar3;
      }
      else {
        uVar2 = *__s_00;
        __s_00 = __s_00 + 1;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,__s_00,(char *)((ulong)uVar2 + (long)__s_00));
      return __return_storage_ptr__;
    }
  case 0:
    __s = "";
    goto LAB_0045f17f;
  case 5:
    __s = "false";
    if ((this->value_).bool_ != false) {
      __s = "true";
    }
LAB_0045f17f:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&oss);
  }
  return __return_storage_ptr__;
}

Assistant:

String Value::asString() const {
  switch (type()) {
  case nullValue:
    return "";
  case stringValue: {
    if (value_.string_ == nullptr)
      return "";
    unsigned this_len;
    char const* this_str;
    decodePrefixedString(this->isAllocated(), this->value_.string_, &this_len,
                         &this_str);
    return String(this_str, this_len);
  }
  case booleanValue:
    return value_.bool_ ? "true" : "false";
  case intValue:
    return valueToString(value_.int_);
  case uintValue:
    return valueToString(value_.uint_);
  case realValue:
    return valueToString(value_.real_);
  default:
    JSON_FAIL_MESSAGE("Type is not convertible to string");
  }
}